

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O2

MemoryRegion_conflict *
memory_map_ptr_riscv64(uc_struct_conflict13 *uc,hwaddr begin,size_t size,uint32_t perms,void *ptr)

{
  MemoryRegion_conflict *mr;
  
  mr = (MemoryRegion_conflict *)g_malloc(0xa0);
  memory_region_init_ram_ptr_riscv64(uc,mr,size,ptr);
  mr->perms = perms;
  if ((mr->addr == 0xffffffffffffffff) || (mr->ram_block == (RAMBlock *)0x0)) {
    g_free(mr);
    mr = (MemoryRegion_conflict *)0x0;
  }
  else {
    memory_region_add_subregion_riscv64((MemoryRegion_conflict *)uc->system_memory,begin,mr);
    if (uc->cpu != (CPUState *)0x0) {
      tlb_flush_riscv64(uc->cpu);
    }
  }
  return mr;
}

Assistant:

MemoryRegion *memory_map_ptr(struct uc_struct *uc, hwaddr begin, size_t size, uint32_t perms, void *ptr)
{
    MemoryRegion *ram = g_new(MemoryRegion, 1);

    memory_region_init_ram_ptr(uc, ram, size, ptr);
    ram->perms = perms;
    if (ram->addr == -1 || !ram->ram_block) {
        // out of memory
        g_free(ram);
        return NULL;
    }

    memory_region_add_subregion(uc->system_memory, begin, ram);

    if (uc->cpu) {
        tlb_flush(uc->cpu);
    }

    return ram;
}